

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepSVtolerances(void *arkode_mem,realtype reltol,N_Vector abstol)

{
  int iVar1;
  char *msgfmt;
  realtype rVar2;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepSVtolerances",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else if (*(int *)((long)arkode_mem + 0x250) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
  }
  else {
    if (0.0 <= reltol) {
      if (abstol == (N_Vector)0x0) {
        msgfmt = "abstol = NULL illegal.";
      }
      else if (abstol->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
        msgfmt = "Missing N_VMin routine from N_Vector";
      }
      else {
        rVar2 = N_VMin(abstol);
        if (0.0 <= rVar2) {
          *(uint *)((long)arkode_mem + 0x38) = -(uint)(rVar2 == 0.0) & 1;
          if (*(int *)((long)arkode_mem + 0x248) == 0) {
            iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0xf0),
                                (N_Vector *)((long)arkode_mem + 0x30));
            if (iVar1 == 0) {
              arkProcessError((ARKodeMem)arkode_mem,-0x14,"ARKode","arkSVtolerances",
                              "Allocation of arkode_mem failed.");
              return -0x16;
            }
            *(undefined4 *)((long)arkode_mem + 0x248) = 1;
          }
          N_VScale(1.0,abstol,*(N_Vector *)((long)arkode_mem + 0x30));
          *(realtype *)((long)arkode_mem + 0x20) = reltol;
          *(undefined4 *)((long)arkode_mem + 0x18) = 1;
          *(undefined4 *)((long)arkode_mem + 0x54) = 0;
          *(code **)((long)arkode_mem + 0x58) = arkEwtSetSV;
          *(void **)((long)arkode_mem + 0x60) = arkode_mem;
          return 0;
        }
        msgfmt = "abstol has negative component(s) (illegal).";
      }
    }
    else {
      msgfmt = "reltol < 0 illegal.";
    }
    iVar1 = -0x16;
  }
  arkProcessError((ARKodeMem)arkode_mem,iVar1,"ARKode","arkSVtolerances",msgfmt);
  return iVar1;
}

Assistant:

int MRIStepSVtolerances(void *arkode_mem, realtype reltol, N_Vector abstol)
{
  /* unpack ark_mem, call arkSVtolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepSVtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkSVtolerances(ark_mem, reltol, abstol));
}